

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_writers.h
# Opt level: O2

string * __thiscall
cppwinrt::
get_impl_name<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
          (string *__return_storage_ptr__,cppwinrt *this,
          basic_string_view<char,_std::char_traits<char>_> *first,
          basic_string_view<char,_std::char_traits<char>_> *rest)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_class_8_1_6971b95b convert;
  string result;
  
  paVar1 = &result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  convert.result = &result;
  result._M_dataplus._M_p = (pointer)paVar1;
  get_impl_name<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>(std::basic_string_view<char,std::char_traits<char>>const&,std::basic_string_view<char,std::char_traits<char>>const&)
  ::{lambda(auto:1&&)#1}::operator()
            ((_lambda_auto_1____1_ *)&convert,
             (basic_string_view<char,_std::char_traits<char>_> *)this);
  std::__cxx11::string::push_back((char)&result);
  get_impl_name<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>(std::basic_string_view<char,std::char_traits<char>>const&,std::basic_string_view<char,std::char_traits<char>>const&)
  ::{lambda(auto:1&&)#1}::operator()((_lambda_auto_1____1_ *)&convert,first);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result._M_dataplus._M_p == paVar1) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(result.field_2._M_allocated_capacity._1_7_,result.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = result.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = result._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(result.field_2._M_allocated_capacity._1_7_,result.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = result._M_string_length;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  result._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

auto get_impl_name(First const& first, Rest const&... rest)
    {
        std::string result;

        auto convert = [&](auto&& value)
        {
            for (auto&& c : value)
            {
                result += c == '.' ? '_' : c;
            }
        };

        convert(first);
        ((result += '_', convert(rest)), ...);
        return result;
    }